

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutils.h
# Opt level: O0

void multiply_mat(double *m1,double *m2,double *res,int m1_rows,int inner_dim,int m2_cols)

{
  int inner;
  int col;
  int row;
  double sum;
  int m2_cols_local;
  int inner_dim_local;
  int m1_rows_local;
  double *res_local;
  double *m2_local;
  double *m1_local;
  
  res_local = res;
  for (row = 0; row < m1_rows; row = row + 1) {
    for (col = 0; col < m2_cols; col = col + 1) {
      sum = 0.0;
      for (inner = 0; inner < inner_dim; inner = inner + 1) {
        sum = m1[row * inner_dim + inner] * m2[inner * m2_cols + col] + sum;
      }
      *res_local = sum;
      res_local = res_local + 1;
    }
  }
  return;
}

Assistant:

static inline void multiply_mat(const double *m1, const double *m2, double *res,
                                const int m1_rows, const int inner_dim,
                                const int m2_cols) {
  double sum;

  int row, col, inner;
  for (row = 0; row < m1_rows; ++row) {
    for (col = 0; col < m2_cols; ++col) {
      sum = 0;
      for (inner = 0; inner < inner_dim; ++inner)
        sum += m1[row * inner_dim + inner] * m2[inner * m2_cols + col];
      *(res++) = sum;
    }
  }
}